

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcApi.c
# Opt level: O1

int Mvc_CoverIsTautology(Mvc_Cover_t *pCover)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = 0;
  if ((pCover->lCubes).nItems == 1) {
    iVar1 = 1;
    if (0 < pCover->nBits) {
      uVar2 = 0;
      do {
        if ((((pCover->lCubes).pHead)->pData[uVar2 >> 5] >> (uVar2 & 0x1f) & 1) == 0) {
          return 0;
        }
        uVar2 = uVar2 + 1;
      } while (pCover->nBits != uVar2);
    }
  }
  return iVar1;
}

Assistant:

int Mvc_CoverIsTautology( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int iBit, Value;

    if ( Mvc_CoverReadCubeNum(pCover) != 1 )
        return 0;

    pCube = Mvc_CoverReadCubeHead( pCover );
    Mvc_CubeForEachBit( pCover, pCube, iBit, Value )
        if ( Value == 0 )
            return 0;
    return 1;
}